

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O3

BOOL compare_opcodes(PCRE2_SPTR8 code,BOOL utf,compile_block_8 *cb,uint32_t *base_list,
                    PCRE2_SPTR8 base_end,int *rec_limit)

{
  uint *puVar1;
  byte *pbVar2;
  byte bVar3;
  uint8_t uVar4;
  int iVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  ushort uVar10;
  BOOL BVar11;
  uint *puVar12;
  byte *pbVar13;
  uint *puVar14;
  long lVar15;
  uint32_t uVar16;
  uint uVar17;
  uint uVar18;
  uint32_t *puVar19;
  uint32_t c;
  uint32_t *puVar20;
  uint *puVar21;
  byte *pbVar22;
  bool bVar23;
  bool bVar24;
  uint local_88;
  int local_84;
  uint32_t list [8];
  
  iVar5 = *rec_limit;
  *rec_limit = iVar5 + -1;
  if (iVar5 < 2) {
    return 0;
  }
  list._24_8_ = base_list + 2;
  puVar1 = base_list + 3;
  uVar8 = 0;
LAB_00131994:
  while( true ) {
    for (; bVar3 = *code, bVar3 == 0x76; code = code + 6) {
    }
    pbVar22 = code;
    if (bVar3 != 0x77) break;
    code = code + (ushort)(*(ushort *)(code + 5) << 8 | *(ushort *)(code + 5) >> 8);
  }
  while (bVar3 == 0x78) {
    uVar10 = *(ushort *)(pbVar22 + 1) << 8 | *(ushort *)(pbVar22 + 1) >> 8;
    bVar3 = pbVar22[uVar10];
    pbVar22 = pbVar22 + uVar10;
  }
  switch(bVar3) {
  case 0x79:
    if (base_list[1] == 0) {
      return 0;
    }
    if ((byte)(pbVar22[-(ulong)(ushort)(*(ushort *)(pbVar22 + 1) << 8 |
                                       *(ushort *)(pbVar22 + 1) >> 8)] + 0x82) < 6) {
      return uVar8 ^ 1;
    }
    bVar3 = '\x03';
    break;
  case 0x7a:
  case 0x7b:
  case 0x7d:
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
  case 0x85:
switchD_001319e1_caseD_7a:
    code = get_chr_property_list(pbVar22,utf,cb->fcc,&local_88);
    if (code == (byte *)0x0) {
      return 0;
    }
    uVar18 = *base_list;
    puVar14 = list + 1;
    puVar20 = &local_88;
    puVar21 = list;
    puVar19 = (uint32_t *)list._24_8_;
    if ((uVar18 == 0x1d) ||
       (puVar19 = list, puVar14 = puVar1, puVar20 = base_list, puVar21 = (uint *)list._24_8_,
       local_88 == 0x1d)) {
      c = *puVar19;
      pbVar22 = code;
      if (puVar20 != &local_88) {
        pbVar22 = base_end;
      }
      do {
        BVar11 = 0;
        uVar6 = *puVar20;
        if (0x6d < (int)uVar6) {
          if (uVar6 == 0x6e) {
            if (c < 0x100) goto LAB_00131e9e;
          }
          else {
            if (uVar6 == 0x6f) {
              if (0xff < c) {
                return 0;
              }
LAB_00131e9e:
              bVar3 = pbVar22[(ulong)(c >> 3) - (ulong)*puVar21] >> (c & 7) & 1;
              goto joined_r0x00131eba;
            }
            if (uVar6 != 0x70) {
              return 0;
            }
            BVar11 = _pcre2_xclass_8(c,pbVar22 + (2 - (ulong)*puVar21),utf);
            if (BVar11 != 0) {
              return 0;
            }
          }
          goto switchD_00131ba7_caseD_18;
        }
        switch(uVar6) {
        case 6:
          if (0xff < c) {
            return 0;
          }
          bVar3 = cb->ctypes[c] & 4;
          goto joined_r0x00131da8;
        case 7:
          if (c < 0x100) {
            bVar3 = cb->ctypes[c] & 4;
joined_r0x00131eba:
            if (bVar3 != 0) {
              return 0;
            }
          }
          break;
        case 8:
          if (0xff < c) {
            return 0;
          }
          bVar3 = cb->ctypes[c] & 1;
          goto joined_r0x00131da8;
        case 9:
          if (c < 0x100) {
            bVar3 = cb->ctypes[c] & 1;
            goto joined_r0x00131eba;
          }
          break;
        case 10:
          if (0xff < c) {
            return 0;
          }
          bVar3 = cb->ctypes[c] & 0x10;
joined_r0x00131da8:
          if (bVar3 == 0) {
            return 0;
          }
          break;
        case 0xb:
          if (c < 0xff) {
            bVar3 = cb->ctypes[c] & 0x10;
            goto joined_r0x00131eba;
          }
          break;
        default:
          goto switchD_00131ba7_caseD_c;
        case 0xf:
        case 0x10:
          bVar23 = uVar6 == 0xf;
          uVar16 = c + 0x7f;
          if (-1 < (int)c) {
            uVar16 = c;
          }
          if (8 < *puVar21 - 1) {
            return 0;
          }
          uVar10 = _pcre2_ucd_stage2_8[(long)((int)c % 0x80) + (ulong)""[(int)uVar16 >> 7] * 0x80];
          switch(*puVar21) {
          case 1:
            uVar4 = _pcre2_ucd_records_8[uVar10].chartype;
            bVar24 = true;
            if ((uVar4 != '\x05') && (uVar4 != '\t')) {
              bVar24 = uVar4 == '\b';
            }
            bVar23 = bVar24 == bVar23;
            break;
          case 2:
            bVar23 = _pcre2_ucp_gentype_8[_pcre2_ucd_records_8[uVar10].chartype] == *puVar14;
            goto LAB_00132024;
          case 3:
            bVar3 = _pcre2_ucd_records_8[uVar10].chartype;
            goto LAB_00131fc2;
          case 4:
            bVar3 = _pcre2_ucd_records_8[uVar10].script;
LAB_00131fc2:
            bVar23 = *puVar14 == (uint)bVar3;
            goto LAB_00132024;
          case 5:
            bVar23 = (_pcre2_ucp_gentype_8[_pcre2_ucd_records_8[uVar10].chartype] & 0xfffffffd) == 1
            ;
LAB_00132024:
            bVar23 = !bVar23 != (uVar6 == 0xf);
            break;
          default:
            if ((int)c < 0x2000) {
              if ((int)c < 0x85) {
                if ((0x20 < c) || ((0x100003e00U >> ((ulong)c & 0x3f) & 1) == 0)) goto LAB_00132194;
              }
              else if ((int)c < 0x1680) {
                if ((c != 0x85) && (c != 0xa0)) {
LAB_00132194:
                  bVar23 = (_pcre2_ucp_gentype_8[_pcre2_ucd_records_8[uVar10].chartype] != 6) !=
                           (uVar6 == 0xf);
                }
              }
              else if ((c != 0x1680) && (c != 0x180e)) goto LAB_00132194;
            }
            else if ((10 < c - 0x2000) &&
                    (((0x37 < c - 0x2028 ||
                      ((0x80000000000083U >> ((ulong)(c - 0x2028) & 0x3f) & 1) == 0)) &&
                     (c != 0x3000)))) goto LAB_00132194;
            break;
          case 8:
            bVar23 = ((_pcre2_ucp_gentype_8[_pcre2_ucd_records_8[uVar10].chartype] | 2) == 3 ||
                     c == 0x5f) == bVar23;
            break;
          case 9:
            puVar12 = _pcre2_ucd_caseless_sets_8 + _pcre2_ucd_records_8[uVar10].caseset;
            do {
              uVar18 = *puVar12;
              if (c < uVar18) {
                bVar23 = uVar6 != 0xf;
                break;
              }
              puVar12 = puVar12 + 1;
            } while (uVar18 != c);
          }
          if (!bVar23) {
            return 0;
          }
          break;
        case 0x11:
        case 0x15:
        case 0x17:
        case 0x19:
          if (c - 10 < 4) {
            return 0;
          }
          if (c - 0x2028 < 2) {
            return 0;
          }
          if (c == 0x85) {
            return 0;
          }
          break;
        case 0x12:
          if ((int)c < 0x2000) {
            if ((int)c < 0xa0) {
              if ((c != 9) && (c != 0x20)) {
                return 0;
              }
            }
            else if (((c != 0xa0) && (c != 0x1680)) && (c != 0x180e)) {
              return 0;
            }
          }
          else if ((int)c < 0x202f) {
            if (10 < c - 0x2000) {
              return 0;
            }
          }
          else if (((c != 0x202f) && (c != 0x205f)) && (c != 0x3000)) {
            return 0;
          }
          break;
        case 0x13:
          if ((int)c < 0x2000) {
            if ((int)c < 0xa0) {
              if (c == 9) {
                return 0;
              }
              if (c == 0x20) {
                return 0;
              }
            }
            else {
              if (c == 0xa0) {
                return 0;
              }
              if (c == 0x1680) {
                return 0;
              }
              if (c == 0x180e) {
                return 0;
              }
            }
          }
          else if ((int)c < 0x202f) {
            if (c - 0x2000 < 0xb) {
              return 0;
            }
          }
          else {
            if (c == 0x202f) {
              return 0;
            }
            if (c == 0x205f) {
              return 0;
            }
            if (c == 0x3000) {
              return 0;
            }
          }
          break;
        case 0x14:
          if (((3 < c - 10) && (1 < c - 0x2028)) && (c != 0x85)) {
            return 0;
          }
          break;
        case 0x18:
          break;
        case 0x1d:
          uVar18 = *puVar21;
          puVar12 = puVar21 + 1;
          do {
            if (c == uVar18) {
              return 0;
            }
            uVar18 = *puVar12;
            puVar12 = puVar12 + 1;
          } while (uVar18 != 0xffffffff);
          break;
        case 0x1f:
          uVar18 = *puVar21;
          puVar12 = puVar21 + 1;
          while (c != uVar18) {
            uVar18 = *puVar12;
            puVar12 = puVar12 + 1;
            if (uVar18 == 0xffffffff) {
              return 0;
            }
          }
          if (c == 0xffffffff) {
            return 0;
          }
        }
switchD_00131ba7_caseD_18:
        c = puVar19[1];
        puVar19 = puVar19 + 1;
      } while (c != 0xffffffff);
    }
    else {
      if ((local_88 == 0x6e || uVar18 == 0x6e) ||
         ((utf == 0 && (uVar18 == 0x6f || local_88 == 0x6f)))) {
        if ((uVar18 == 0x6e) ||
           (puVar14 = (uint *)list._24_8_, pbVar22 = code, puVar19 = base_list, uVar17 = list[0],
           uVar18 == 0x6f && utf == 0)) {
          puVar14 = list;
          pbVar22 = base_end;
          puVar19 = &local_88;
          uVar18 = local_88;
          uVar17 = *(uint *)list._24_8_;
        }
        bVar23 = false;
        bVar24 = false;
        bVar9 = false;
        switch(uVar18) {
        case 6:
          bVar23 = true;
        case 7:
          pbVar13 = cb->cbits + 0x40;
          break;
        case 8:
          bVar24 = true;
        case 9:
          bVar23 = bVar24;
          pbVar13 = cb->cbits;
          break;
        case 10:
          bVar9 = true;
        case 0xb:
          bVar23 = bVar9;
          pbVar13 = cb->cbits + 0xa0;
          break;
        default:
          if (uVar18 - 0x6e < 2) {
            pbVar13 = code;
            if (puVar19 != &local_88) {
              pbVar13 = base_end;
            }
            pbVar13 = pbVar13 + -(ulong)*puVar14;
          }
          else {
            if (uVar18 != 0x70) {
              return 0;
            }
            pbVar13 = code;
            if (puVar19 != &local_88) {
              pbVar13 = base_end;
            }
            if ((pbVar13[2 - (ulong)*puVar14] & 4) != 0) {
              return 0;
            }
            if ((pbVar13[2 - (ulong)*puVar14] & 2) == 0) goto LAB_00132425;
            pbVar13 = pbVar13 + (3 - (ulong)*puVar14);
          }
          goto LAB_0013240c;
        }
        if (bVar23) {
          lVar15 = 0;
          do {
            if ((~pbVar13[lVar15] & pbVar22[lVar15 - (ulong)uVar17]) != 0) {
              return 0;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x20);
        }
        else {
LAB_0013240c:
          lVar15 = 0;
          do {
            if ((pbVar22[lVar15 - (ulong)uVar17] & pbVar13[lVar15]) != 0) {
              return 0;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x20);
        }
        goto LAB_00132425;
      }
      if (1 < uVar18 - 0xf) {
        if (0x10 < uVar18 - 6) {
          return 0;
        }
        if (0x14 < local_88 - 6) {
          return 0;
        }
        if (autoposstab[uVar18 - 6][local_88 - 6] == '\0') {
          return 0;
        }
        goto LAB_00132425;
      }
      if (local_88 == 0x18) goto LAB_00132425;
      if (1 < local_88 - 0xf) {
        return 0;
      }
      bVar3 = propposstab[*(uint *)list._24_8_][list[0]];
      if (0x10 < bVar3 - 1) {
        return 0;
      }
      uVar17 = (uint)bVar3;
      switch((uint)bVar3) {
      case 1:
        if (uVar18 != 0x10) {
          return 0;
        }
        if (local_88 != 0x10) {
          return 0;
        }
        goto LAB_00132425;
      case 2:
        bVar23 = (*puVar1 == list[1]) == (uVar18 == local_88);
        break;
      case 3:
        bVar23 = uVar18 == local_88;
        break;
      case 4:
        if (local_88 != 0x10) {
          return 0;
        }
        uVar17 = *puVar1;
        uVar7 = list[1];
        goto LAB_001325df;
      case 5:
        if (uVar18 != 0x10) {
          return 0;
        }
        uVar17 = list[1];
        uVar7 = *puVar1;
LAB_001325df:
        if ((bool)catposstab[uVar17][uVar7] != (uVar18 == local_88)) {
          return 0;
        }
        goto LAB_00132425;
      default:
        if (local_88 != 0x10) {
          return 0;
        }
        uVar17 = uVar17 - 6;
        bVar23 = false;
        if ((list[1] != posspropstab[uVar17][0]) && (list[1] != posspropstab[uVar17][1])) {
          uVar17 = list[1] ^ posspropstab[uVar17][2] | uVar18 ^ 0x10;
LAB_00132503:
          bVar23 = uVar17 != 0;
        }
        goto LAB_00132507;
      case 9:
      case 10:
      case 0xb:
        if (uVar18 != 0x10) {
          return 0;
        }
        uVar17 = uVar17 - 9;
        uVar18 = *puVar1;
        bVar23 = false;
        if ((uVar18 != posspropstab[uVar17][0]) && (uVar18 != posspropstab[uVar17][1])) {
          uVar18 = uVar18 ^ posspropstab[uVar17][2] | local_88 ^ 0x10;
LAB_0013258e:
          bVar23 = uVar18 != 0;
        }
        goto LAB_00132592;
      case 0xc:
      case 0xd:
      case 0xe:
        if (local_88 != 0x10) {
          return 0;
        }
        uVar17 = uVar17 - 0xc;
        bVar23 = false;
        if ((*(char *)((long)catposstab +
                      (ulong)list[1] +
                      (ulong)posspropstab[uVar17][0] * 0x20 + (ulong)posspropstab[uVar17][0] * -2)
             != '\0') &&
           (bVar23 = false,
           *(char *)((long)catposstab +
                    (ulong)list[1] +
                    (ulong)posspropstab[uVar17][1] * 0x20 + (ulong)posspropstab[uVar17][1] * -2) !=
           '\0')) {
          uVar17 = posspropstab[uVar17][3] ^ list[1] | uVar18 ^ 0x10;
          goto LAB_00132503;
        }
LAB_00132507:
        if (bVar23 != (uVar18 == 0x10)) {
          return 0;
        }
        goto LAB_00132425;
      case 0xf:
      case 0x10:
      case 0x11:
        if (uVar18 != 0x10) {
          return 0;
        }
        uVar17 = uVar17 - 0xf;
        uVar18 = *puVar1;
        bVar23 = false;
        if ((*(char *)((long)catposstab +
                      (ulong)uVar18 +
                      (ulong)posspropstab[uVar17][0] * 0x20 + (ulong)posspropstab[uVar17][0] * -2)
             != '\0') &&
           (bVar23 = false,
           *(char *)((long)catposstab +
                    (ulong)uVar18 +
                    (ulong)posspropstab[uVar17][1] * 0x20 + (ulong)posspropstab[uVar17][1] * -2) !=
           '\0')) {
          uVar18 = posspropstab[uVar17][3] ^ uVar18 | local_88 ^ 0x10;
          goto LAB_0013258e;
        }
LAB_00132592:
        if (bVar23 != (local_88 == 0x10)) {
          return 0;
        }
        goto LAB_00132425;
      }
      if (bVar23) {
        return 0;
      }
    }
LAB_00132425:
    if (local_84 == 0) {
      BVar11 = 1;
switchD_00131ba7_caseD_c:
      return BVar11;
    }
    goto LAB_00131994;
  case 0x7c:
switchD_001319e1_caseD_7c:
    return (uint)(base_list[1] != 0);
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x86:
    uVar10 = *(ushort *)(pbVar22 + 1) << 8 | *(ushort *)(pbVar22 + 1) >> 8;
    code = pbVar22 + "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                     [bVar3];
    uVar8 = 1;
    if (pbVar22[uVar10] == 0x78) {
      pbVar22 = pbVar22 + uVar10;
      do {
        BVar11 = compare_opcodes(code,utf,cb,base_list,base_end,rec_limit);
        if (BVar11 == 0) {
          return 0;
        }
        code = pbVar22 + 3;
        uVar10 = *(ushort *)(pbVar22 + 1) << 8 | *(ushort *)(pbVar22 + 1) >> 8;
        pbVar13 = pbVar22 + uVar10;
        pbVar22 = pbVar22 + uVar10;
      } while (*pbVar13 == 0x78);
    }
    goto LAB_00131994;
  default:
    if (1 < bVar3 - 0x94) {
      if (bVar3 == 0) goto switchD_001319e1_caseD_7c;
      goto switchD_001319e1_caseD_7a;
    }
    if ((2 < pbVar22[1] - 0x82) && (pbVar22[1] != 0x86)) {
      return 0;
    }
    pbVar13 = pbVar22 + 1;
    do {
      uVar10 = *(ushort *)(pbVar13 + 1) << 8 | *(ushort *)(pbVar13 + 1) >> 8;
      pbVar2 = pbVar13 + uVar10;
      pbVar13 = pbVar13 + uVar10;
    } while (*pbVar2 == 0x78);
    BVar11 = compare_opcodes(pbVar13 + 3,utf,cb,base_list,base_end,rec_limit);
    if (BVar11 == 0) {
      return 0;
    }
    bVar3 = "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
            [bVar3];
  }
  code = pbVar22 + bVar3;
  goto LAB_00131994;
}

Assistant:

static BOOL
compare_opcodes(PCRE2_SPTR code, BOOL utf, const compile_block *cb,
  const uint32_t *base_list, PCRE2_SPTR base_end, int *rec_limit)
{
PCRE2_UCHAR c;
uint32_t list[8];
const uint32_t *chr_ptr;
const uint32_t *ochr_ptr;
const uint32_t *list_ptr;
PCRE2_SPTR next_code;
#ifdef SUPPORT_WIDE_CHARS
PCRE2_SPTR xclass_flags;
#endif
const uint8_t *class_bitset;
const uint8_t *set1, *set2, *set_end;
uint32_t chr;
BOOL accepted, invert_bits;
BOOL entered_a_group = FALSE;

if (--(*rec_limit) <= 0) return FALSE;  /* Recursion has gone too deep */

/* Note: the base_list[1] contains whether the current opcode has a greedy
(represented by a non-zero value) quantifier. This is a different from
other character type lists, which store here that the character iterator
matches to an empty string (also represented by a non-zero value). */

for(;;)
  {
  /* All operations move the code pointer forward.
  Therefore infinite recursions are not possible. */

  c = *code;

  /* Skip over callouts */

  if (c == OP_CALLOUT)
    {
    code += PRIV(OP_lengths)[c];
    continue;
    }

  if (c == OP_CALLOUT_STR)
    {
    code += GET(code, 1 + 2*LINK_SIZE);
    continue;
    }

  if (c == OP_ALT)
    {
    do code += GET(code, 1); while (*code == OP_ALT);
    c = *code;
    }

  switch(c)
    {
    case OP_END:
    case OP_KETRPOS:
    /* TRUE only in greedy case. The non-greedy case could be replaced by
    an OP_EXACT, but it is probably not worth it. (And note that OP_EXACT
    uses more memory, which we cannot get at this stage.) */

    return base_list[1] != 0;

    case OP_KET:
    /* If the bracket is capturing, and referenced by an OP_RECURSE, or
    it is an atomic sub-pattern (assert, once, etc.) the non-greedy case
    cannot be converted to a possessive form. */

    if (base_list[1] == 0) return FALSE;

    switch(*(code - GET(code, 1)))
      {
      case OP_ASSERT:
      case OP_ASSERT_NOT:
      case OP_ASSERTBACK:
      case OP_ASSERTBACK_NOT:
      case OP_ONCE:
      case OP_ONCE_NC:
      /* Atomic sub-patterns and assertions can always auto-possessify their
      last iterator. However, if the group was entered as a result of checking
      a previous iterator, this is not possible. */

      return !entered_a_group;
      }

    code += PRIV(OP_lengths)[c];
    continue;

    case OP_ONCE:
    case OP_ONCE_NC:
    case OP_BRA:
    case OP_CBRA:
    next_code = code + GET(code, 1);
    code += PRIV(OP_lengths)[c];

    while (*next_code == OP_ALT)
      {
      if (!compare_opcodes(code, utf, cb, base_list, base_end, rec_limit))
        return FALSE;
      code = next_code + 1 + LINK_SIZE;
      next_code += GET(next_code, 1);
      }

    entered_a_group = TRUE;
    continue;

    case OP_BRAZERO:
    case OP_BRAMINZERO:

    next_code = code + 1;
    if (*next_code != OP_BRA && *next_code != OP_CBRA
        && *next_code != OP_ONCE && *next_code != OP_ONCE_NC) return FALSE;

    do next_code += GET(next_code, 1); while (*next_code == OP_ALT);

    /* The bracket content will be checked by the OP_BRA/OP_CBRA case above. */

    next_code += 1 + LINK_SIZE;
    if (!compare_opcodes(next_code, utf, cb, base_list, base_end, rec_limit))
      return FALSE;

    code += PRIV(OP_lengths)[c];
    continue;

    default:
    break;
    }

  /* Check for a supported opcode, and load its properties. */

  code = get_chr_property_list(code, utf, cb->fcc, list);
  if (code == NULL) return FALSE;    /* Unsupported */

  /* If either opcode is a small character list, set pointers for comparing
  characters from that list with another list, or with a property. */

  if (base_list[0] == OP_CHAR)
    {
    chr_ptr = base_list + 2;
    list_ptr = list;
    }
  else if (list[0] == OP_CHAR)
    {
    chr_ptr = list + 2;
    list_ptr = base_list;
    }

  /* Character bitsets can also be compared to certain opcodes. */

  else if (base_list[0] == OP_CLASS || list[0] == OP_CLASS
#if PCRE2_CODE_UNIT_WIDTH == 8
      /* In 8 bit, non-UTF mode, OP_CLASS and OP_NCLASS are the same. */
      || (!utf && (base_list[0] == OP_NCLASS || list[0] == OP_NCLASS))
#endif
      )
    {
#if PCRE2_CODE_UNIT_WIDTH == 8
    if (base_list[0] == OP_CLASS || (!utf && base_list[0] == OP_NCLASS))
#else
    if (base_list[0] == OP_CLASS)
#endif
      {
      set1 = (uint8_t *)(base_end - base_list[2]);
      list_ptr = list;
      }
    else
      {
      set1 = (uint8_t *)(code - list[2]);
      list_ptr = base_list;
      }

    invert_bits = FALSE;
    switch(list_ptr[0])
      {
      case OP_CLASS:
      case OP_NCLASS:
      set2 = (uint8_t *)
        ((list_ptr == list ? code : base_end) - list_ptr[2]);
      break;

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      xclass_flags = (list_ptr == list ? code : base_end) - list_ptr[2] + LINK_SIZE;
      if ((*xclass_flags & XCL_HASPROP) != 0) return FALSE;
      if ((*xclass_flags & XCL_MAP) == 0)
        {
        /* No bits are set for characters < 256. */
        if (list[1] == 0) return TRUE;
        /* Might be an empty repeat. */
        continue;
        }
      set2 = (uint8_t *)(xclass_flags + 1);
      break;
#endif

      case OP_NOT_DIGIT:
      invert_bits = TRUE;
      /* Fall through */
      case OP_DIGIT:
      set2 = (uint8_t *)(cb->cbits + cbit_digit);
      break;

      case OP_NOT_WHITESPACE:
      invert_bits = TRUE;
      /* Fall through */
      case OP_WHITESPACE:
      set2 = (uint8_t *)(cb->cbits + cbit_space);
      break;

      case OP_NOT_WORDCHAR:
      invert_bits = TRUE;
      /* Fall through */
      case OP_WORDCHAR:
      set2 = (uint8_t *)(cb->cbits + cbit_word);
      break;

      default:
      return FALSE;
      }

    /* Because the bit sets are unaligned bytes, we need to perform byte
    comparison here. */

    set_end = set1 + 32;
    if (invert_bits)
      {
      do
        {
        if ((*set1++ & ~(*set2++)) != 0) return FALSE;
        }
      while (set1 < set_end);
      }
    else
      {
      do
        {
        if ((*set1++ & *set2++) != 0) return FALSE;
        }
      while (set1 < set_end);
      }

    if (list[1] == 0) return TRUE;
    /* Might be an empty repeat. */
    continue;
    }

  /* Some property combinations also acceptable. Unicode property opcodes are
  processed specially; the rest can be handled with a lookup table. */

  else
    {
    uint32_t leftop, rightop;

    leftop = base_list[0];
    rightop = list[0];

#ifdef SUPPORT_UNICODE
    accepted = FALSE; /* Always set in non-unicode case. */
    if (leftop == OP_PROP || leftop == OP_NOTPROP)
      {
      if (rightop == OP_EOD)
        accepted = TRUE;
      else if (rightop == OP_PROP || rightop == OP_NOTPROP)
        {
        int n;
        const uint8_t *p;
        BOOL same = leftop == rightop;
        BOOL lisprop = leftop == OP_PROP;
        BOOL risprop = rightop == OP_PROP;
        BOOL bothprop = lisprop && risprop;

        /* There's a table that specifies how each combination is to be
        processed:
          0   Always return FALSE (never auto-possessify)
          1   Character groups are distinct (possessify if both are OP_PROP)
          2   Check character categories in the same group (general or particular)
          3   Return TRUE if the two opcodes are not the same
          ... see comments below
        */

        n = propposstab[base_list[2]][list[2]];
        switch(n)
          {
          case 0: break;
          case 1: accepted = bothprop; break;
          case 2: accepted = (base_list[3] == list[3]) != same; break;
          case 3: accepted = !same; break;

          case 4:  /* Left general category, right particular category */
          accepted = risprop && catposstab[base_list[3]][list[3]] == same;
          break;

          case 5:  /* Right general category, left particular category */
          accepted = lisprop && catposstab[list[3]][base_list[3]] == same;
          break;

          /* This code is logically tricky. Think hard before fiddling with it.
          The posspropstab table has four entries per row. Each row relates to
          one of PCRE's special properties such as ALNUM or SPACE or WORD.
          Only WORD actually needs all four entries, but using repeats for the
          others means they can all use the same code below.

          The first two entries in each row are Unicode general categories, and
          apply always, because all the characters they include are part of the
          PCRE character set. The third and fourth entries are a general and a
          particular category, respectively, that include one or more relevant
          characters. One or the other is used, depending on whether the check
          is for a general or a particular category. However, in both cases the
          category contains more characters than the specials that are defined
          for the property being tested against. Therefore, it cannot be used
          in a NOTPROP case.

          Example: the row for WORD contains ucp_L, ucp_N, ucp_P, ucp_Po.
          Underscore is covered by ucp_P or ucp_Po. */

          case 6:  /* Left alphanum vs right general category */
          case 7:  /* Left space vs right general category */
          case 8:  /* Left word vs right general category */
          p = posspropstab[n-6];
          accepted = risprop && lisprop ==
            (list[3] != p[0] &&
             list[3] != p[1] &&
            (list[3] != p[2] || !lisprop));
          break;

          case 9:   /* Right alphanum vs left general category */
          case 10:  /* Right space vs left general category */
          case 11:  /* Right word vs left general category */
          p = posspropstab[n-9];
          accepted = lisprop && risprop ==
            (base_list[3] != p[0] &&
             base_list[3] != p[1] &&
            (base_list[3] != p[2] || !risprop));
          break;

          case 12:  /* Left alphanum vs right particular category */
          case 13:  /* Left space vs right particular category */
          case 14:  /* Left word vs right particular category */
          p = posspropstab[n-12];
          accepted = risprop && lisprop ==
            (catposstab[p[0]][list[3]] &&
             catposstab[p[1]][list[3]] &&
            (list[3] != p[3] || !lisprop));
          break;

          case 15:  /* Right alphanum vs left particular category */
          case 16:  /* Right space vs left particular category */
          case 17:  /* Right word vs left particular category */
          p = posspropstab[n-15];
          accepted = lisprop && risprop ==
            (catposstab[p[0]][base_list[3]] &&
             catposstab[p[1]][base_list[3]] &&
            (base_list[3] != p[3] || !risprop));
          break;
          }
        }
      }

    else
#endif  /* SUPPORT_UNICODE */

    accepted = leftop >= FIRST_AUTOTAB_OP && leftop <= LAST_AUTOTAB_LEFT_OP &&
           rightop >= FIRST_AUTOTAB_OP && rightop <= LAST_AUTOTAB_RIGHT_OP &&
           autoposstab[leftop - FIRST_AUTOTAB_OP][rightop - FIRST_AUTOTAB_OP];

    if (!accepted) return FALSE;

    if (list[1] == 0) return TRUE;
    /* Might be an empty repeat. */
    continue;
    }

  /* Control reaches here only if one of the items is a small character list.
  All characters are checked against the other side. */

  do
    {
    chr = *chr_ptr;

    switch(list_ptr[0])
      {
      case OP_CHAR:
      ochr_ptr = list_ptr + 2;
      do
        {
        if (chr == *ochr_ptr) return FALSE;
        ochr_ptr++;
        }
      while(*ochr_ptr != NOTACHAR);
      break;

      case OP_NOT:
      ochr_ptr = list_ptr + 2;
      do
        {
        if (chr == *ochr_ptr)
          break;
        ochr_ptr++;
        }
      while(*ochr_ptr != NOTACHAR);
      if (*ochr_ptr == NOTACHAR) return FALSE;   /* Not found */
      break;

      /* Note that OP_DIGIT etc. are generated only when PCRE2_UCP is *not*
      set. When it is set, \d etc. are converted into OP_(NOT_)PROP codes. */

      case OP_DIGIT:
      if (chr < 256 && (cb->ctypes[chr] & ctype_digit) != 0) return FALSE;
      break;

      case OP_NOT_DIGIT:
      if (chr > 255 || (cb->ctypes[chr] & ctype_digit) == 0) return FALSE;
      break;

      case OP_WHITESPACE:
      if (chr < 256 && (cb->ctypes[chr] & ctype_space) != 0) return FALSE;
      break;

      case OP_NOT_WHITESPACE:
      if (chr > 255 || (cb->ctypes[chr] & ctype_space) == 0) return FALSE;
      break;

      case OP_WORDCHAR:
      if (chr < 255 && (cb->ctypes[chr] & ctype_word) != 0) return FALSE;
      break;

      case OP_NOT_WORDCHAR:
      if (chr > 255 || (cb->ctypes[chr] & ctype_word) == 0) return FALSE;
      break;

      case OP_HSPACE:
      switch(chr)
        {
        HSPACE_CASES: return FALSE;
        default: break;
        }
      break;

      case OP_NOT_HSPACE:
      switch(chr)
        {
        HSPACE_CASES: break;
        default: return FALSE;
        }
      break;

      case OP_ANYNL:
      case OP_VSPACE:
      switch(chr)
        {
        VSPACE_CASES: return FALSE;
        default: break;
        }
      break;

      case OP_NOT_VSPACE:
      switch(chr)
        {
        VSPACE_CASES: break;
        default: return FALSE;
        }
      break;

      case OP_DOLL:
      case OP_EODN:
      switch (chr)
        {
        case CHAR_CR:
        case CHAR_LF:
        case CHAR_VT:
        case CHAR_FF:
        case CHAR_NEL:
#ifndef EBCDIC
        case 0x2028:
        case 0x2029:
#endif  /* Not EBCDIC */
        return FALSE;
        }
      break;

      case OP_EOD:    /* Can always possessify before \z */
      break;

#ifdef SUPPORT_UNICODE
      case OP_PROP:
      case OP_NOTPROP:
      if (!check_char_prop(chr, list_ptr[2], list_ptr[3],
            list_ptr[0] == OP_NOTPROP))
        return FALSE;
      break;
#endif

      case OP_NCLASS:
      if (chr > 255) return FALSE;
      /* Fall through */

      case OP_CLASS:
      if (chr > 255) break;
      class_bitset = (uint8_t *)
        ((list_ptr == list ? code : base_end) - list_ptr[2]);
      if ((class_bitset[chr >> 3] & (1 << (chr & 7))) != 0) return FALSE;
      break;

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      if (PRIV(xclass)(chr, (list_ptr == list ? code : base_end) -
          list_ptr[2] + LINK_SIZE, utf)) return FALSE;
      break;
#endif

      default:
      return FALSE;
      }

    chr_ptr++;
    }
  while(*chr_ptr != NOTACHAR);

  /* At least one character must be matched from this opcode. */

  if (list[1] == 0) return TRUE;
  }

/* Control never reaches here. There used to be a fail-save return FALSE; here,
but some compilers complain about an unreachable statement. */
}